

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

String * axl::io::getDir(String *__return_storage_ptr__,StringRef *filePath)

{
  char *pcVar1;
  ulong uVar2;
  StringRef local_38;
  
  uVar2 = filePath->m_length;
  if (uVar2 != 0) {
    pcVar1 = filePath->m_p + uVar2;
    uVar2 = ~uVar2;
    do {
      pcVar1 = pcVar1 + -1;
      if (pcVar1 < filePath->m_p) goto LAB_0013711f;
      uVar2 = uVar2 + 1;
    } while (*pcVar1 != '/');
    if (uVar2 != 0) {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLeftSubString
                (&local_38,filePath,-uVar2);
      goto LAB_00137147;
    }
  }
LAB_0013711f:
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
  local_38.m_p = (C *)0x0;
  local_38.m_hdr._0_1_ = 0;
  local_38.m_hdr._1_7_ = 0;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_38,(BufHdr *)0x0);
  local_38.m_p = (C *)0x0;
  local_38.m_length._0_1_ = 0;
  local_38.m_length._1_7_ = 0;
  local_38.m_isNullTerminated = false;
LAB_00137147:
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,&local_38);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_38);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getDir(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t drive[4] = { 0 };
	wchar_t dir[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		drive, countof(drive) - 1,
		dir, countof(dir) - 1,
		NULL, 0,
		NULL, 0
	);

	sl::String string = drive;
	string.append(dir);
	return string;

#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getLeftSubString(i + 1) : NULL;
#endif
}